

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O0

bool __thiscall
mocker::detail::InterferenceGraph::isAdjacent(InterferenceGraph *this,Node *u,Node *v)

{
  bool bVar1;
  element_type *peVar2;
  string *__lhs;
  string *__rhs;
  _Node_iterator_base<std::pair<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
  local_60 [3];
  pair<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_> local_48;
  _Node_iterator_base<std::pair<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
  local_28;
  Node *local_20;
  Node *v_local;
  Node *u_local;
  InterferenceGraph *this_local;
  
  local_20 = v;
  v_local = u;
  u_local = (Node *)this;
  peVar2 = std::
           __shared_ptr_access<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)u);
  __lhs = nasm::Register::getIdentifier_abi_cxx11_(peVar2);
  peVar2 = std::
           __shared_ptr_access<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)v);
  __rhs = nasm::Register::getIdentifier_abi_cxx11_(peVar2);
  bVar1 = std::operator<(__lhs,__rhs);
  if (bVar1) {
    std::swap<mocker::nasm::Register>(u,v);
  }
  std::make_pair<std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Register>&>
            (&local_48,u,v);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_set<std::pair<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_mocker::detail::InterferenceGraph::NodePairHash,_mocker::detail::InterferenceGraph::NodePairEqual,_std::allocator<std::pair<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>_>
       ::find(&this->edges,&local_48);
  local_60[0]._M_cur =
       (__node_type *)
       std::
       unordered_set<std::pair<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_mocker::detail::InterferenceGraph::NodePairHash,_mocker::detail::InterferenceGraph::NodePairEqual,_std::allocator<std::pair<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>_>
       ::end(&this->edges);
  bVar1 = std::__detail::operator!=(&local_28,local_60);
  std::pair<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>::
  ~pair(&local_48);
  return bVar1;
}

Assistant:

bool InterferenceGraph::isAdjacent(Node u, Node v) const {
  if (u->getIdentifier() < v->getIdentifier())
    std::swap(u, v);
  return edges.find(std::make_pair(u, v)) != edges.end();
}